

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_8_pd7_i(void)

{
  uint value;
  
  value = m68ki_read_imm_8();
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] - 2;
  m68ki_write_8_fc(m68ki_cpu.dar[0xf],m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_8_pd7_i(void)
{
	uint res = OPER_I_8();
	uint ea = EA_A7_PD_8();

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}